

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O3

PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>
* mwheel::
  Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>
  ::get_instance(bool reset)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  creator_type *__x;
  undefined8 uVar1;
  creator_type creator;
  _Any_data local_48;
  _Any_data local_30;
  _Manager_type local_20;
  _Invoker_type local_18;
  
  if (Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
      ::get_instance(bool)::pnt_abi_cxx11_ == '\0') {
    Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
    ::get_instance();
  }
  if (Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
      ::get_instance(bool)::pnt_abi_cxx11_.
      super___shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0 || reset) {
    check_creator();
    __x = get_creator();
    std::
    function<std::shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>_()>
    ::function((function<std::shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>_>_()>
                *)&local_30,__x);
    if (local_20 == (code *)0x0) {
      uVar1 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar1);
    }
    (*local_18)(&local_48);
    uVar1 = local_48._8_8_;
    Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
    ::get_instance(bool)::pnt_abi_cxx11_.
    super___shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_48._M_unused._0_8_;
    this = Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
           ::get_instance(bool)::pnt_abi_cxx11_.
           super___shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
    ::get_instance(bool)::pnt_abi_cxx11_.
    super___shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
    if ((this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
  }
  return Singleton<mwheel::PrototypeFactory<mwheel::test::ClientInterface,std::__cxx11::string,std::shared_ptr<mwheel::test::ClientInterface>>>
         ::get_instance(bool)::pnt_abi_cxx11_.
         super___shared_ptr<mwheel::PrototypeFactory<mwheel::test::ClientInterface,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mwheel::test::ClientInterface>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
}

Assistant:

static T &get_instance(bool reset = false) {
    static auto pnt = std::shared_ptr<T>(nullptr);
    if (!pnt || reset) {
      check_creator();
      auto creator = get_creator();
      pnt = creator();
    }
    return *pnt;
  }